

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

size_t __thiscall
c4::basic_substring<const_char>::find
          (basic_substring<const_char> *this,ro_substr pattern,size_t start_pos)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  error_flags eVar4;
  ulong in_RCX;
  ulong in_RDX;
  long in_RSI;
  long *in_RDI;
  size_t j;
  bool gotit;
  size_t e;
  size_t i;
  ulong local_58;
  ulong local_40;
  
  bVar2 = true;
  if (in_RCX != 0xffffffffffffffff) {
    bVar2 = in_RCX <= (ulong)in_RDI[1];
  }
  if (!bVar2) {
    eVar4 = get_error_flags();
    if (((eVar4 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    handle_error(0x347f4b,(char *)0x160a,"check failed: %s",
                 "start_pos == npos || (start_pos >= 0 && start_pos <= len)");
  }
  if (in_RDX <= (ulong)in_RDI[1]) {
    lVar1 = in_RDI[1];
    for (local_40 = in_RCX; local_40 < (lVar1 - in_RDX) + 1; local_40 = local_40 + 1) {
      bVar2 = true;
      for (local_58 = 0; local_58 < in_RDX; local_58 = local_58 + 1) {
        if ((ulong)in_RDI[1] <= local_40 + local_58) {
          eVar4 = get_error_flags();
          if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
            trap_instruction();
          }
          handle_error(0x347f4b,(char *)0x1611,"check failed: %s","i + j < len");
        }
        if (*(char *)(*in_RDI + local_40 + local_58) != *(char *)(in_RSI + local_58)) {
          bVar2 = false;
          break;
        }
      }
      if (bVar2) {
        return local_40;
      }
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

inline size_t find(ro_substr pattern, size_t start_pos=0) const
    {
        C4_ASSERT(start_pos == npos || (start_pos >= 0 && start_pos <= len));
        if(len < pattern.len) return npos;
        for(size_t i = start_pos, e = len - pattern.len + 1; i < e; ++i)
        {
            bool gotit = true;
            for(size_t j = 0; j < pattern.len; ++j)
            {
                C4_ASSERT(i + j < len);
                if(str[i + j] != pattern.str[j])
                {
                    gotit = false;
                    break;
                }
            }
            if(gotit)
            {
                return i;
            }
        }
        return npos;
    }